

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.c
# Opt level: O3

void av1_set_size_dependent_vars(AV1_COMP *cpi,int *q,int *bottom_index,int *top_index)

{
  segmentation *seg;
  undefined1 *puVar1;
  byte bVar2;
  AV1_PRIMARY *pAVar3;
  AV1_PRIMARY *pAVar4;
  TplDepFrame *pTVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  int iVar13;
  int iVar14;
  aom_rc_mode aVar15;
  int iVar16;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  int mi_row;
  int iVar20;
  double dVar21;
  double dVar22;
  double dStack_b0;
  
  av1_set_speed_features_framesize_dependent(cpi,cpi->speed);
  pAVar3 = cpi->ppi;
  if ((cpi->oxcf).algo_cfg.enable_tpl_model == true) {
    iVar13 = av1_tpl_stats_ready(&pAVar3->tpl_data,(uint)cpi->gf_frame_index);
    if (iVar13 != 0) {
      pAVar4 = cpi->ppi;
      pTVar5 = (pAVar4->tpl_data).tpl_frame;
      uVar19 = (ulong)((uint)cpi->gf_frame_index * 0x60);
      if (*(char *)((long)pTVar5->ref_map_index + (uVar19 - 0x20)) != '\0') {
        bVar2 = (pAVar4->tpl_data).tpl_stats_block_mis_log2;
        iVar20 = (uint)(cpi->common).superres_scale_denominator << (bVar2 & 0x1f);
        puVar1 = (undefined1 *)((long)pTVar5->ref_map_index + (uVar19 - 0x20));
        iVar13 = iVar20 + 4;
        iVar20 = iVar20 + 0xb;
        if (-1 < iVar13) {
          iVar20 = iVar13;
        }
        iVar13 = (cpi->common).mi_params.mi_rows;
        if (0 < iVar13) {
          lVar6 = *(long *)((long)pTVar5->ref_map_index + (uVar19 - 0x18));
          iVar16 = *(int *)(puVar1 + 0x40);
          uVar18 = (cpi->common).superres_upscaled_width + 7 >> 2 & 0xfffffffe;
          dVar21 = 0.0;
          dStack_b0 = 0.0;
          mi_row = 0;
          dVar22 = 1.0;
          do {
            if (0 < (int)uVar18) {
              iVar13 = 0;
              do {
                auVar12._8_4_ = SUB84(dStack_b0,0);
                auVar12._0_8_ = dVar21;
                auVar12._12_4_ = (int)((ulong)dStack_b0 >> 0x20);
                iVar14 = av1_tpl_ptr_pos(mi_row,iVar13,iVar16,
                                         (pAVar4->tpl_data).tpl_stats_block_mis_log2);
                lVar17 = (long)iVar14 * 200;
                dVar9 = (double)*(long *)(lVar6 + 8 + lVar17);
                iVar14 = *(int *)(puVar1 + 0x54);
                lVar7 = *(long *)(lVar6 + 0x40 + lVar17);
                lVar8 = *(long *)(lVar6 + 0x48 + lVar17);
                dVar10 = (double)(*(long *)(lVar6 + 0x18 + lVar17) << 7);
                dVar11 = log(dVar10);
                dVar10 = log((double)(lVar8 * 0x80 + (iVar14 * lVar7 + 0x100 >> 9)) + dVar10);
                dStack_b0 = auVar12._8_8_;
                dVar22 = dVar22 + dVar9;
                dVar21 = dVar21 + dVar9 * dVar11;
                dStack_b0 = dStack_b0 + dVar9 * dVar10;
                iVar13 = iVar13 + (iVar20 >> 3);
              } while (iVar13 < (int)uVar18);
              iVar13 = (cpi->common).mi_params.mi_rows;
            }
            mi_row = mi_row + (1 << (bVar2 & 0x1f));
          } while (mi_row < iVar13);
          if ((dStack_b0 != 0.0) || (NAN(dStack_b0))) {
            dVar21 = exp((dVar21 - dStack_b0) / dVar22);
            (cpi->rd).r0 = dVar21;
            bVar2 = (pAVar4->gf_group).update_type[cpi->gf_frame_index];
            if ((bVar2 < 4) && (bVar2 != 1)) {
              pAVar4 = cpi->ppi;
              if (pAVar4->lap_enabled == 0) {
                dVar22 = (pAVar4->tpl_data).r0_adjust_factor;
                dVar9 = (double)(cpi->rc).frames_to_key;
                iVar13 = (pAVar4->p_rc).gfu_boost;
                if (dVar9 < 0.0) {
                  dVar9 = sqrt(dVar9);
                }
                else {
                  dVar9 = SQRT(dVar9);
                }
                if (12.0 <= dVar9) {
                  dVar9 = 12.0;
                }
                if (dVar9 <= 4.0) {
                  dVar9 = 4.0;
                }
                dVar21 = ((double)iVar13 * (dVar9 + -4.0) +
                         (double)(int)((dVar22 * 200.0) / dVar21) * (8.0 - (dVar9 + -4.0))) * 0.125;
              }
              else {
                dVar21 = (double)(pAVar4->p_rc).baseline_gf_interval;
                if (dVar21 < 0.0) {
                  dVar21 = sqrt(dVar21);
                }
                else {
                  dVar21 = SQRT(dVar21);
                }
                dVar22 = (cpi->rd).r0;
                dVar9 = (double)(cpi->ppi->p_rc).num_stats_required_for_gfu_boost;
                if (dVar9 < 0.0) {
                  dVar9 = sqrt(dVar9);
                }
                else {
                  dVar9 = SQRT(dVar9);
                }
                if (10.0 <= dVar9) {
                  dVar9 = 10.0;
                }
                if (dVar9 <= dVar21) {
                  dVar9 = dVar21;
                }
                dVar22 = rint((dVar9 * 10.0 + 200.0) / dVar22);
                dVar9 = (double)(cpi->ppi->p_rc).num_stats_used_for_gfu_boost;
                iVar13 = (cpi->ppi->p_rc).gfu_boost;
                if (dVar9 < 0.0) {
                  dVar9 = sqrt(dVar9);
                }
                else {
                  dVar9 = SQRT(dVar9);
                }
                if (12.0 <= dVar9) {
                  dVar9 = 12.0;
                }
                if (dVar9 <= dVar21) {
                  dVar9 = dVar21;
                }
                dVar21 = ((double)iVar13 * (dVar9 - dVar21) +
                         (double)(int)dVar22 * ((12.0 - dVar21) - (dVar9 - dVar21))) /
                         (12.0 - dVar21);
              }
              (cpi->ppi->p_rc).gfu_boost = (int)dVar21;
            }
            goto LAB_001b8c07;
          }
        }
        *puVar1 = 0;
      }
LAB_001b8c07:
      av1_tpl_rdmult_setup(cpi);
    }
  }
  iVar13 = av1_rc_pick_q_and_bounds
                     (cpi,(cpi->common).width,(cpi->common).height,(uint)cpi->gf_frame_index,
                      bottom_index,top_index);
  *q = iVar13;
  aVar15 = (cpi->oxcf).rc_cfg.mode;
  if (aVar15 == AOM_CBR) {
    if ((cpi->rc).force_max_q != 0) {
      *q = (cpi->rc).worst_quality;
      (cpi->rc).force_max_q = 0;
      aVar15 = (cpi->oxcf).rc_cfg.mode;
      goto LAB_001b8c6c;
    }
  }
  else {
LAB_001b8c6c:
    if (aVar15 == AOM_Q) {
      if ((*(char *)((long)((cpi->ppi->tpl_data).tpl_frame)->ref_map_index +
                    ((ulong)((uint)cpi->gf_frame_index * 0x60) - 0x20)) != '\0') &&
         (((cpi->oxcf).rc_cfg.best_allowed_q != 0 || ((cpi->oxcf).rc_cfg.worst_allowed_q != 0)))) {
        iVar16 = av1_tpl_get_q_index(&cpi->ppi->tpl_data,(uint)cpi->gf_frame_index,
                                     (cpi->rc).active_worst_quality,
                                     ((cpi->common).seq_params)->bit_depth);
        iVar13 = (cpi->oxcf).rc_cfg.worst_allowed_q;
        iVar20 = (cpi->oxcf).rc_cfg.best_allowed_q;
        if (iVar16 < iVar13) {
          iVar13 = iVar16;
        }
        if (iVar16 < iVar20) {
          iVar13 = iVar20;
        }
        *q = iVar13;
        *bottom_index = iVar13;
        *top_index = iVar13;
        if ((pAVar3->gf_group).update_type[cpi->gf_frame_index] == '\x03') {
          (cpi->ppi->p_rc).arf_q = *q;
        }
      }
    }
  }
  if (((cpi->oxcf).q_cfg.use_fixed_qp_offsets != 0) && ((cpi->oxcf).rc_cfg.mode == AOM_Q)) {
    bVar2 = (pAVar3->gf_group).update_type[cpi->gf_frame_index];
    if ((bVar2 < 4) && (bVar2 != 1)) {
      iVar13 = (cpi->rc).active_worst_quality;
      iVar13 = av1_get_q_index_from_qstep_ratio
                         (iVar13,((double)iVar13 / -255.0 + 1.0) *
                                 *(double *)
                                  (&DAT_004d3ba0 +
                                  (ulong)(0x14 < (cpi->ppi->p_rc).baseline_gf_interval) * 8) + 0.2,
                          ((cpi->common).seq_params)->bit_depth);
      *q = iVar13;
      *bottom_index = iVar13;
      *top_index = iVar13;
      bVar2 = (pAVar3->gf_group).update_type[cpi->gf_frame_index];
      if ((bVar2 < 4) && (bVar2 != 1)) {
        (cpi->ppi->p_rc).arf_q = *q;
      }
    }
    else {
      iVar13 = (pAVar3->gf_group).layer_depth[cpi->gf_frame_index];
      if (iVar13 < (pAVar3->gf_group).max_layer_depth) {
        iVar20 = (cpi->ppi->p_rc).arf_q;
        if (1 < iVar13) {
          iVar16 = (cpi->oxcf).rc_cfg.cq_level;
          uVar18 = iVar13 + 1;
          do {
            iVar20 = ((iVar20 + iVar16) - (iVar20 + iVar16 + 1 >> 0x1f)) + 1 >> 1;
            uVar18 = uVar18 - 1;
          } while (2 < uVar18);
        }
        *q = iVar20;
        *bottom_index = iVar20;
        *top_index = iVar20;
      }
    }
  }
  if ((AOM_RC_FIRST_PASS < (cpi->oxcf).pass) && ((cpi->sf).hl_sf.static_segmentation != 0)) {
    seg = &(cpi->common).seg;
    if ((cpi->common).current_frame.frame_type == '\0') {
      memset((cpi->enc_seg).map,0,
             (long)(cpi->common).mi_params.mi_cols * (long)(cpi->common).mi_params.mi_rows);
      (cpi->common).seg.update_map = '\0';
      (cpi->common).seg.update_data = '\0';
      av1_disable_segmentation(seg);
LAB_001b8f95:
      av1_clearall_segfeatures(seg);
      return;
    }
    dVar21 = (cpi->ppi->p_rc).avg_q;
    if ((cpi->refresh_frame).alt_ref_frame == true) {
      memset((cpi->enc_seg).map,0,
             (long)(cpi->common).mi_params.mi_cols * (long)(cpi->common).mi_params.mi_rows);
      (cpi->common).seg.update_map = '\0';
      (cpi->common).seg.update_data = '\0';
      av1_disable_segmentation(seg);
      av1_clearall_segfeatures(seg);
      if ((cpi->common).seg.enabled != '\0') {
        (cpi->common).seg.update_map = '\x01';
        (cpi->common).seg.update_data = '\x01';
        iVar13 = av1_compute_qdelta(&cpi->rc,dVar21,dVar21 * 0.875,
                                    ((cpi->common).seq_params)->bit_depth);
        av1_set_segdata(seg,1,'\0',iVar13 + -2);
        av1_set_segdata(seg,1,'\x02',-2);
        av1_set_segdata(seg,1,'\x01',-2);
        av1_set_segdata(seg,1,'\x03',-2);
        av1_set_segdata(seg,1,'\x04',-2);
        av1_enable_segfeature(seg,1,'\x02');
        av1_enable_segfeature(seg,1,'\x01');
        av1_enable_segfeature(seg,1,'\x03');
        av1_enable_segfeature(seg,1,'\x04');
        av1_enable_segfeature(seg,1,'\0');
        return;
      }
    }
    else if (seg->enabled != '\0') {
      if ((cpi->rc).frames_since_golden == 0) {
        av1_disable_segmentation(seg);
        memset((cpi->enc_seg).map,0,
               (long)(cpi->common).mi_params.mi_cols * (long)(cpi->common).mi_params.mi_rows);
        (cpi->common).seg.update_map = '\0';
        (cpi->common).seg.update_data = '\0';
        goto LAB_001b8f95;
      }
      if ((cpi->rc).is_src_frame_alt_ref == 0) {
        (cpi->common).seg.update_map = '\0';
        (cpi->common).seg.update_data = '\0';
      }
      else {
        av1_enable_segfeature(seg,0,'\x05');
        av1_enable_segfeature(seg,1,'\x05');
        av1_clear_segdata(seg,0,'\x05');
        av1_set_segdata(seg,0,'\x05',7);
        av1_clear_segdata(seg,1,'\x05');
        av1_set_segdata(seg,1,'\x05',7);
        if (48.0 < dVar21) {
          av1_enable_segfeature(seg,0,'\x06');
          av1_enable_segfeature(seg,1,'\x06');
        }
        (cpi->common).seg.update_data = '\x01';
      }
    }
  }
  return;
}

Assistant:

void av1_set_size_dependent_vars(AV1_COMP *cpi, int *q, int *bottom_index,
                                 int *top_index) {
  AV1_COMMON *const cm = &cpi->common;

  // Setup variables that depend on the dimensions of the frame.
  av1_set_speed_features_framesize_dependent(cpi, cpi->speed);

#if !CONFIG_REALTIME_ONLY
  GF_GROUP *gf_group = &cpi->ppi->gf_group;
  if (cpi->oxcf.algo_cfg.enable_tpl_model &&
      av1_tpl_stats_ready(&cpi->ppi->tpl_data, cpi->gf_frame_index)) {
    process_tpl_stats_frame(cpi);
    av1_tpl_rdmult_setup(cpi);
  }
#endif

  // Decide q and q bounds.
  *q = av1_rc_pick_q_and_bounds(cpi, cm->width, cm->height, cpi->gf_frame_index,
                                bottom_index, top_index);

  if (cpi->oxcf.rc_cfg.mode == AOM_CBR && cpi->rc.force_max_q) {
    *q = cpi->rc.worst_quality;
    cpi->rc.force_max_q = 0;
  }

#if !CONFIG_REALTIME_ONLY
  if (cpi->oxcf.rc_cfg.mode == AOM_Q &&
      cpi->ppi->tpl_data.tpl_frame[cpi->gf_frame_index].is_valid &&
      !is_lossless_requested(&cpi->oxcf.rc_cfg)) {
    const RateControlCfg *const rc_cfg = &cpi->oxcf.rc_cfg;
    const int tpl_q = av1_tpl_get_q_index(
        &cpi->ppi->tpl_data, cpi->gf_frame_index, cpi->rc.active_worst_quality,
        cm->seq_params->bit_depth);
    *q = clamp(tpl_q, rc_cfg->best_allowed_q, rc_cfg->worst_allowed_q);
    *top_index = *bottom_index = *q;
    if (gf_group->update_type[cpi->gf_frame_index] == ARF_UPDATE)
      cpi->ppi->p_rc.arf_q = *q;
  }

  if (cpi->oxcf.q_cfg.use_fixed_qp_offsets && cpi->oxcf.rc_cfg.mode == AOM_Q) {
    if (is_frame_tpl_eligible(gf_group, cpi->gf_frame_index)) {
      const double qratio_grad =
          cpi->ppi->p_rc.baseline_gf_interval > 20 ? 0.2 : 0.3;
      const double qstep_ratio =
          0.2 +
          (1.0 - (double)cpi->rc.active_worst_quality / MAXQ) * qratio_grad;
      *q = av1_get_q_index_from_qstep_ratio(
          cpi->rc.active_worst_quality, qstep_ratio, cm->seq_params->bit_depth);
      *top_index = *bottom_index = *q;
      if (gf_group->update_type[cpi->gf_frame_index] == ARF_UPDATE ||
          gf_group->update_type[cpi->gf_frame_index] == KF_UPDATE ||
          gf_group->update_type[cpi->gf_frame_index] == GF_UPDATE)
        cpi->ppi->p_rc.arf_q = *q;
    } else if (gf_group->layer_depth[cpi->gf_frame_index] <
               gf_group->max_layer_depth) {
      int this_height = gf_group->layer_depth[cpi->gf_frame_index];
      int arf_q = cpi->ppi->p_rc.arf_q;
      while (this_height > 1) {
        arf_q = (arf_q + cpi->oxcf.rc_cfg.cq_level + 1) / 2;
        --this_height;
      }
      *top_index = *bottom_index = *q = arf_q;
    }
  }
#endif

  // Configure experimental use of segmentation for enhanced coding of
  // static regions if indicated.
  // Only allowed in the second pass of a two pass encode, as it requires
  // lagged coding, and if the relevant speed feature flag is set.
  if (is_stat_consumption_stage_twopass(cpi) &&
      cpi->sf.hl_sf.static_segmentation)
    configure_static_seg_features(cpi);
}